

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

void fdb_cmp_func_list_from_filemgr(filemgr *file,list *cmp_func_list)

{
  fdb_custom_cmp_variable p_Var1;
  avl_node *paVar2;
  void *pvVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  undefined8 *puVar6;
  size_t sVar7;
  char *__dest;
  kvs_header *pkVar8;
  
  if ((file != (filemgr *)0x0) &&
     (cmp_func_list != (list *)0x0 && file->kv_header != (kvs_header *)0x0)) {
    pthread_spin_lock(&file->kv_header->lock);
    pkVar8 = file->kv_header;
    p_Var1 = pkVar8->default_kvs_cmp;
    if (p_Var1 != (fdb_custom_cmp_variable)0x0) {
      pvVar3 = calloc(1,0x28);
      *(fdb_custom_cmp_variable *)((long)pvVar3 + 8) = p_Var1;
      *(void **)((long)pvVar3 + 0x10) = pkVar8->default_kvs_cmp_param;
      list_push_back(cmp_func_list,(list_elem *)((long)pvVar3 + 0x18));
      pkVar8 = file->kv_header;
    }
    paVar4 = avl_first(pkVar8->idx_name);
    while (paVar4 != (avl_node *)0x0) {
      paVar5 = avl_next(paVar4);
      puVar6 = (undefined8 *)calloc(1,0x28);
      paVar2 = paVar4[-5].parent;
      puVar6[1] = paVar4[-6].right;
      puVar6[2] = paVar2;
      paVar4 = paVar4[-7].left;
      sVar7 = strlen((char *)paVar4);
      __dest = (char *)calloc(1,sVar7 + 1);
      *puVar6 = __dest;
      strcpy(__dest,(char *)paVar4);
      list_push_back(cmp_func_list,(list_elem *)(puVar6 + 3));
      paVar4 = paVar5;
    }
    pthread_spin_unlock(&file->kv_header->lock);
    return;
  }
  return;
}

Assistant:

void fdb_cmp_func_list_from_filemgr(struct filemgr *file, struct list *cmp_func_list)
{
    if (!file || !file->kv_header || !cmp_func_list) {
        return;
    }

    struct cmp_func_node *node;

    spin_lock(&file->kv_header->lock);
    // Default KV store cmp function
    if (file->kv_header->default_kvs_cmp) {
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        node->func = file->kv_header->default_kvs_cmp;
        node->user_param = file->kv_header->default_kvs_cmp_param;
        node->kvs_name = NULL;
        list_push_back(cmp_func_list, &node->le);
    }

    // Rest of KV stores
    struct kvs_node *kvs_node;
    struct avl_node *a = avl_first(file->kv_header->idx_name);
    while (a) {
        kvs_node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        node->func = kvs_node->custom_cmp;
        node->user_param = kvs_node->user_param;
        node->kvs_name = (char*)calloc(1, strlen(kvs_node->kvs_name)+1);
        strcpy(node->kvs_name, kvs_node->kvs_name);
        list_push_back(cmp_func_list, &node->le);
    }
    spin_unlock(&file->kv_header->lock);
}